

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

cmFileLockResult __thiscall cmFileLockPool::ScopePool::Release(ScopePool *this,string *filename)

{
  bool bVar1;
  cmFileLockResult cVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (_List_node_base *)this;
  do {
    p_Var3 = (((List *)&p_Var3->_M_next)->
             super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)this) {
      cVar2 = cmFileLockResult::MakeOk();
      return cVar2;
    }
    bVar1 = cmFileLock::IsLocked(*(cmFileLock **)(p_Var3 + 1),filename);
  } while (!bVar1);
  cVar2 = cmFileLock::Release(*(cmFileLock **)(p_Var3 + 1));
  return cVar2;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Release(
    const std::string& filename)
{
  for (It i = this->Locks.begin(); i != this->Locks.end(); ++i)
    {
    if ((*i)->IsLocked(filename))
      {
      return (*i)->Release();
      }
    }
  return cmFileLockResult::MakeOk();
}